

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::create_regex_term<std::initializer_list<char_const*>>
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          initializer_list<const_char_*> regex_piece,string *keyword)

{
  initializer_list<const_char_*> __ils;
  initializer_list<const_char_*> __ils_00;
  size_type sVar1;
  char **ppcVar2;
  ostream *poVar3;
  ulong local_1a8;
  size_t i;
  ostringstream os;
  string *keyword_local;
  initializer_list<const_char_*> regex_piece_local;
  
  regex_piece_local._M_array = regex_piece._M_array;
  keyword_local = (string *)this;
  regex_piece_local._M_len = (size_type)__return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&i);
  local_1a8 = 0;
  while( true ) {
    sVar1 = std::initializer_list<const_char_*>::size
                      ((initializer_list<const_char_*> *)&keyword_local);
    if (sVar1 - 1 <= local_1a8) break;
    __ils_00._M_len = (size_type)regex_piece_local._M_array;
    __ils_00._M_array = (iterator)keyword_local;
    ppcVar2 = std::begin<char_const*>(__ils_00);
    poVar3 = std::operator<<((ostream *)&i,ppcVar2[local_1a8]);
    std::operator<<(poVar3,(string *)regex_piece._M_len);
    local_1a8 = local_1a8 + 1;
  }
  __ils._M_len = (size_type)regex_piece_local._M_array;
  __ils._M_array = (iterator)keyword_local;
  ppcVar2 = std::begin<char_const*>(__ils);
  sVar1 = std::initializer_list<const_char_*>::size
                    ((initializer_list<const_char_*> *)&keyword_local);
  std::operator<<((ostream *)&i,ppcVar2[sVar1 - 1]);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string create_regex_term(T1 regex_piece, const std::string& keyword) {
    std::ostringstream os;
    for(size_t i = 0; i < regex_piece.size()-1; ++i) {
        os << std::begin(regex_piece)[i] << keyword;
    }
    os << std::begin(regex_piece)[regex_piece.size()-1];
    return os.str();
}